

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_SPCod_SPCoc
                   (opj_j2k_v2_t *p_j2k,OPJ_UINT32 compno,OPJ_BYTE *p_header_data,
                   OPJ_UINT32 *p_header_size,opj_event_mgr *p_manager)

{
  uint *puVar1;
  uint *in_RCX;
  OPJ_BYTE *in_RDX;
  uint in_ESI;
  long in_RDI;
  opj_event_mgr_t *in_R8;
  OPJ_BYTE *l_current_ptr;
  opj_tccp_t *l_tccp;
  opj_tcp_v2_t *l_tcp;
  opj_cp_v2_t *l_cp;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 i;
  long local_60;
  OPJ_BYTE *local_58;
  uint local_38;
  uint local_34;
  opj_event_mgr_t *local_30;
  uint *local_28;
  uint local_14;
  long local_10;
  opj_bool local_4;
  
  if (*(int *)(in_RDI + 8) == 0x10) {
    local_60 = *(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630;
  }
  else {
    local_60 = *(long *)(in_RDI + 0x10);
  }
  puVar1 = (uint *)(*(long *)(local_60 + 0x15d0) + (ulong)in_ESI * 0x438);
  if (*in_RCX < 5) {
    opj_event_msg_v2(in_R8,1,"Error reading SPCod SPCoc element\n");
    local_4 = 0;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    opj_read_bytes_LE(in_RDX,puVar1 + 1,1);
    puVar1[1] = puVar1[1] + 1;
    if (*(uint *)(in_RDI + 0xd8) < puVar1[1]) {
      opj_read_bytes_LE(in_RDX + 1,puVar1 + 2,1);
      puVar1[2] = puVar1[2] + 2;
      opj_read_bytes_LE(in_RDX + 2,puVar1 + 3,1);
      puVar1[3] = puVar1[3] + 2;
      opj_read_bytes_LE(in_RDX + 3,puVar1 + 4,1);
      opj_read_bytes_LE(in_RDX + 4,puVar1 + 5,1);
      local_58 = in_RDX + 5;
      *local_28 = *local_28 - 5;
      if ((*puVar1 & 1) == 0) {
        for (local_34 = 0; local_34 < puVar1[1]; local_34 = local_34 + 1) {
          puVar1[(ulong)local_34 + 0xcb] = 0xf;
          puVar1[(ulong)local_34 + 0xec] = 0xf;
        }
      }
      else {
        if (*local_28 < puVar1[1]) {
          opj_event_msg_v2(local_30,1,"Error reading SPCod SPCoc element\n");
          return 0;
        }
        for (local_34 = 0; local_34 < puVar1[1]; local_34 = local_34 + 1) {
          opj_read_bytes_LE(local_58,&local_38,1);
          local_58 = local_58 + 1;
          puVar1[(ulong)local_34 + 0xcb] = local_38 & 0xf;
          puVar1[(ulong)local_34 + 0xec] = local_38 >> 4;
        }
        *local_28 = *local_28 - puVar1[1];
      }
      local_4 = 1;
    }
    else {
      opj_event_msg_v2(local_30,1,
                       "Error decoding component %d.\nThe number of resolutions to remove is higher than the number of resolutions of this component\nModify the cp_reduce parameter.\n\n"
                       ,(ulong)local_14);
      *(uint *)(local_10 + 8) = *(uint *)(local_10 + 8) | 0x8000;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_SPCod_SPCoc(
						    opj_j2k_v2_t *p_j2k,
							OPJ_UINT32 compno,
							OPJ_BYTE * p_header_data,
							OPJ_UINT32 * p_header_size,
							struct opj_event_mgr * p_manager
							)
{
	OPJ_UINT32 i, l_tmp;
	opj_cp_v2_t *l_cp = NULL;
	opj_tcp_v2_t *l_tcp = NULL;
	opj_tccp_t *l_tccp = NULL;
	OPJ_BYTE * l_current_ptr = NULL;

	/* preconditions */
	assert(p_j2k != 00);
	assert(p_manager != 00);
	assert(p_header_data != 00);

	l_cp = &(p_j2k->m_cp);
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;

	/* precondition again */
	assert(compno < p_j2k->m_private_image->numcomps);

	l_tccp = &l_tcp->tccps[compno];
	l_current_ptr = p_header_data;

	/* make sure room is sufficient */
	if (*p_header_size < 5) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading SPCod SPCoc element\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(l_current_ptr, &l_tccp->numresolutions ,1);		/* SPcox (D) */
	++l_tccp->numresolutions;										/* tccp->numresolutions = read() + 1 */
	++l_current_ptr;

	/* If user wants to remove more resolutions than the codestream contains, return error */
	if (l_cp->m_specific_param.m_dec.m_reduce >= l_tccp->numresolutions) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error decoding component %d.\nThe number of resolutions to remove is higher than the number "
					"of resolutions of this component\nModify the cp_reduce parameter.\n\n", compno);
		p_j2k->m_specific_param.m_decoder.m_state |= 0x8000;/* FIXME J2K_DEC_STATE_ERR;*/
		return OPJ_FALSE;
	}

	opj_read_bytes(l_current_ptr,&l_tccp->cblkw ,1);		/* SPcoc (E) */
	++l_current_ptr;
	l_tccp->cblkw += 2;

	opj_read_bytes(l_current_ptr,&l_tccp->cblkh ,1);		/* SPcoc (F) */
	++l_current_ptr;
	l_tccp->cblkh += 2;

	opj_read_bytes(l_current_ptr,&l_tccp->cblksty ,1);		/* SPcoc (G) */
	++l_current_ptr;

	opj_read_bytes(l_current_ptr,&l_tccp->qmfbid ,1);		/* SPcoc (H) */
	++l_current_ptr;

	*p_header_size = *p_header_size - 5;

	/* use custom precinct size ? */
	if (l_tccp->csty & J2K_CCP_CSTY_PRT) {
		if (*p_header_size < l_tccp->numresolutions) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading SPCod SPCoc element\n");
			return OPJ_FALSE;
		}

		for	(i = 0; i < l_tccp->numresolutions; ++i) {
			opj_read_bytes(l_current_ptr,&l_tmp ,1);		/* SPcoc (I_i) */
			++l_current_ptr;
			l_tccp->prcw[i] = l_tmp & 0xf;
			l_tccp->prch[i] = l_tmp >> 4;
		}

		*p_header_size = *p_header_size - l_tccp->numresolutions;
	}
	else {
		/* set default size for the precinct width and height */
		for	(i = 0; i < l_tccp->numresolutions; ++i) {
			l_tccp->prcw[i] = 15;
			l_tccp->prch[i] = 15;
		}
	}

#ifdef WIP_REMOVE_MSD
	/* INDEX >> */
	if (p_j2k->cstr_info && compno == 0) {
		OPJ_UINT32 l_data_size = l_tccp->numresolutions * sizeof(OPJ_UINT32);

		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].cblkh = l_tccp->cblkh;
		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].cblkw = l_tccp->cblkw;
		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].numresolutions = l_tccp->numresolutions;
		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].cblksty = l_tccp->cblksty;
		p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].qmfbid = l_tccp->qmfbid;


		memcpy(p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].pdx,l_tccp->prcw, l_data_size);
		memcpy(p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].pdy,l_tccp->prch, l_data_size);
	}
	/* << INDEX */
#endif

	return OPJ_TRUE;
}